

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

int __thiscall
CVmObjTads::getp_set_method(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_prop_id_t vVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  vm_val_t mval;
  vm_datatype_t local_48;
  undefined4 uStack_44;
  uint uStack_40;
  undefined4 uStack_3c;
  
  if (getp_set_method(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_set_method();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_set_method::desc);
  if (iVar2 == 0) {
    vVar1 = CVmBif::pop_propid_val();
    local_48 = sp_[-1].typ;
    uStack_44 = *(undefined4 *)&sp_[-1].field_0x4;
    uStack_40 = sp_[-1].val.obj;
    uStack_3c = *(undefined4 *)((long)&sp_[-1].val + 4);
    if ((int)local_48 < 0xc) {
      if (local_48 == VM_OBJ) {
        uVar4 = uStack_40 >> 0xc;
        uVar3 = uStack_40 & 0xfff;
        iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar4][uVar3].ptr_ + 8))
                          (G_obj_table_X.pages_[uVar4] + uVar3,CVmObjString::metaclass_reg_);
        if (iVar2 == 0) {
          iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar4][uVar3].ptr_ + 0x70))
                            (G_obj_table_X.pages_[uVar4] + uVar3,0);
          if (iVar2 == 0) goto LAB_00288fbd;
        }
        local_48 = VM_OBJX;
      }
      else {
        if (local_48 != VM_SSTRING) {
LAB_00288fbd:
          err_throw(0x900);
        }
        local_48 = VM_DSTRING;
      }
    }
    else if (local_48 == VM_BIFPTR) {
      local_48 = VM_BIFPTRX;
    }
    else {
      if (local_48 != VM_FUNCPTR) goto LAB_00288fbd;
      local_48 = VM_CODEOFS;
    }
    (*(this->super_CVmObject)._vptr_CVmObject[0xc])(this,G_undo_X,self,(ulong)vVar1,&local_48);
    sp_ = sp_ + -1;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_set_method(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc)
{
    /* check arguments: setMethod(&propid, val) */
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   retrieve the property ID and the method value to set (leave the
     *   value on the stack as gc protection) 
     */
    vm_prop_id_t prop = CVmBif::pop_propid_val(vmg0_);
    vm_val_t mval = *G_stk->get(0);

    /* check the type */
    switch (mval.typ)
    {
    case VM_FUNCPTR:
        /* 
         *   a function pointer translates directly to a regular method, by
         *   directly calling the code body 
         */
        mval.typ = VM_CODEOFS;
        break;

    case VM_OBJ:
        /*
         *   We can accept string and invokable objects.  For either one of
         *   these, we store the object reference and mark it as an
         *   execute-on-eval object rather than an ordinary object value.  
         */
        if (CVmObjString::is_string_obj(vmg_ mval.val.obj)
            || vm_objp(vmg_ mval.val.obj)->get_invoker(vmg_ 0))
        {
            /* 
             *   We can handle this object by executing it on evaluation.
             *   Mark it as a special execute-on-eval object rather than an
             *   ordinary object. 
             */
            mval.typ = VM_OBJX;
        }
        else
        {
            /* it's not an acceptable type of object */
            err_throw(VMERR_BAD_TYPE_BIF);
        }
        break;

    case VM_BIFPTR:
        /* built-in function pointer - mark it as an execute-on-eval bif */
        mval.typ = VM_BIFPTRX;
        break;

    case VM_SSTRING:
        /* 
         *   A constant string translates into a self-printing string.
         *   SSTRING and DSTRING have the same data representation, so we
         *   merely need to switch the type to flag it as print-on-eval. 
         */
        mval.typ = VM_DSTRING;
        break;

    default:
        /* other types are not acceptable */
        err_throw(VMERR_BAD_TYPE_BIF);
    }